

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_mark.cpp
# Opt level: O0

void duckdb::TemplatedMarkJoin<long,duckdb::LessThanEquals>
               (Vector *left,Vector *right,idx_t lcount,idx_t rcount,bool *found_match)

{
  undefined1 right_null_00;
  bool bVar1;
  TemplatedValidityMask<unsigned_long> *in_RCX;
  ulong in_RDX;
  long in_R8;
  bool right_null;
  idx_t ridx;
  idx_t j;
  bool left_null;
  idx_t lidx;
  idx_t i;
  long *rdata;
  long *ldata;
  UnifiedVectorFormat right_data;
  UnifiedVectorFormat left_data;
  UnifiedVectorFormat *in_stack_ffffffffffffff00;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  ulong local_e0;
  UnifiedVectorFormat local_b8;
  SelectionVector *local_70;
  UnifiedVectorFormat *in_stack_ffffffffffffffc0;
  element_type *in_stack_ffffffffffffffc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffd0;
  
  UnifiedVectorFormat::UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  UnifiedVectorFormat::UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  Vector::ToUnifiedFormat
            ((Vector *)in_stack_ffffffffffffffd0._M_pi,(idx_t)in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0);
  Vector::ToUnifiedFormat
            ((Vector *)in_stack_ffffffffffffffd0._M_pi,(idx_t)in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0);
  UnifiedVectorFormat::GetData<long>((UnifiedVectorFormat *)&local_70);
  UnifiedVectorFormat::GetData<long>(&local_b8);
  local_e0 = 0;
  do {
    if (in_RDX <= local_e0) {
      UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_ffffffffffffff00);
      UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_ffffffffffffff00);
      return;
    }
    if ((*(byte *)(in_R8 + local_e0) & 1) == 0) {
      SelectionVector::get_index(local_70,local_e0);
      right_null_00 =
           TemplatedValidityMask<unsigned_long>::RowIsValid
                     (in_stack_ffffffffffffff08,(idx_t)in_stack_ffffffffffffff00);
      if (((right_null_00 ^ 0xff) & 1) == 0) {
        for (in_stack_ffffffffffffff08 = (TemplatedValidityMask<unsigned_long> *)0x0;
            in_stack_ffffffffffffff08 < in_RCX;
            in_stack_ffffffffffffff08 =
                 (TemplatedValidityMask<unsigned_long> *)
                 ((long)&in_stack_ffffffffffffff08->validity_mask + 1)) {
          in_stack_ffffffffffffff00 =
               (UnifiedVectorFormat *)
               SelectionVector::get_index(local_b8.sel,(idx_t)in_stack_ffffffffffffff08);
          bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (in_stack_ffffffffffffff08,(idx_t)in_stack_ffffffffffffff00);
          if ((((bVar1 ^ 0xffU) & 1) == 0) &&
             (bVar1 = ComparisonOperationWrapper<duckdb::LessThanEquals>::Operation<long>
                                ((long *)in_stack_ffffffffffffff08,(long *)in_stack_ffffffffffffff00
                                 ,false,(bool)right_null_00), bVar1)) {
            *(undefined1 *)(in_R8 + local_e0) = 1;
            break;
          }
        }
      }
    }
    local_e0 = local_e0 + 1;
  } while( true );
}

Assistant:

static void TemplatedMarkJoin(Vector &left, Vector &right, idx_t lcount, idx_t rcount, bool found_match[]) {
	using MATCH_OP = ComparisonOperationWrapper<OP>;

	UnifiedVectorFormat left_data, right_data;
	left.ToUnifiedFormat(lcount, left_data);
	right.ToUnifiedFormat(rcount, right_data);

	auto ldata = UnifiedVectorFormat::GetData<T>(left_data);
	auto rdata = UnifiedVectorFormat::GetData<T>(right_data);
	for (idx_t i = 0; i < lcount; i++) {
		if (found_match[i]) {
			continue;
		}
		auto lidx = left_data.sel->get_index(i);
		const auto left_null = !left_data.validity.RowIsValid(lidx);
		if (!MATCH_OP::COMPARE_NULL && left_null) {
			continue;
		}
		for (idx_t j = 0; j < rcount; j++) {
			auto ridx = right_data.sel->get_index(j);
			const auto right_null = !right_data.validity.RowIsValid(ridx);
			if (!MATCH_OP::COMPARE_NULL && right_null) {
				continue;
			}
			if (MATCH_OP::template Operation<T>(ldata[lidx], rdata[ridx], left_null, right_null)) {
				found_match[i] = true;
				break;
			}
		}
	}
}